

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O3

void __thiscall QAuthenticator::setUser(QAuthenticator *this,QString *user)

{
  QAuthenticatorPrivate *pQVar1;
  long lVar2;
  char cVar3;
  QStringView QVar4;
  QStringView QVar5;
  
  pQVar1 = this->d;
  if ((pQVar1 != (QAuthenticatorPrivate *)0x0) &&
     (lVar2 = (pQVar1->user).d.size, lVar2 == (user->d).size)) {
    QVar4.m_data = (pQVar1->user).d.ptr;
    QVar4.m_size = lVar2;
    QVar5.m_data = (user->d).ptr;
    QVar5.m_size = lVar2;
    cVar3 = QtPrivate::equalStrings(QVar4,QVar5);
    if (cVar3 != '\0') {
      return;
    }
  }
  detach(this);
  QString::operator=(&this->d->user,(QString *)user);
  QAuthenticatorPrivate::updateCredentials(this->d);
  return;
}

Assistant:

void QAuthenticator::setUser(const QString &user)
{
    if (!d || d->user != user) {
        detach();
        d->user = user;
        d->updateCredentials();
    }
}